

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O2

int libwebvtt::Parser::ParseNumber(string *line,size_type *idx_ptr)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  
  iVar3 = -1;
  iVar4 = iVar3;
  if (((idx_ptr != (size_type *)0x0) && (uVar5 = *idx_ptr, uVar5 != 0xffffffffffffffff)) &&
     (uVar5 < line->_M_string_length)) {
    pcVar2 = (line->_M_dataplus)._M_p;
    uVar6 = (uint)pcVar2[uVar5];
    if (uVar6 - 0x30 < 10) {
      iVar7 = 0;
      while( true ) {
        uVar5 = uVar5 + 1;
        uVar1 = (int)(char)uVar6 - 0x30;
        iVar4 = iVar7;
        if (((9 < uVar1) || (iVar4 = iVar3, 0xccccccc < iVar7)) ||
           (-0x7fffffd1 - (char)uVar6 < iVar7 * 10)) break;
        iVar7 = uVar1 + iVar7 * 10;
        *idx_ptr = uVar5;
        uVar6 = (uint)(byte)pcVar2[uVar5];
      }
    }
  }
  return iVar4;
}

Assistant:

int Parser::ParseNumber(const std::string& line,
                        std::string::size_type* idx_ptr) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (!isdigit(line[idx]))
    return -1;

  int result = 0;

  while (isdigit(line[idx])) {
    const char c = line[idx];
    const int i = c - '0';

    if (result > INT_MAX / 10)
      return -1;

    result *= 10;

    if (result > INT_MAX - i)
      return -1;

    result += i;

    ++idx;
  }

  return result;
}